

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O3

PAL_ERROR CorUnix::CPalSynchronizationManager::DelegateSignalingToRemoteProcess
                    (CPalThread *pthrCurrent,DWORD dwTargetProcessId,SHMPTR shridSynchData)

{
  CSynchData *this;
  long lVar1;
  long in_FS_OFFSET;
  undefined8 uStack_50;
  LONG local_44;
  undefined1 local_3d;
  DWORD dwSigCount;
  BYTE rgSendBuf [13];
  
  rgSendBuf._5_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  uStack_50 = 0x346d21;
  this = (CSynchData *)SHMPtrToPtr(shridSynchData);
  if (gPID == dwTargetProcessId) {
    uStack_50 = 0x346d5d;
    fprintf(_stderr,"] %s %s:%d","DelegateSignalingToRemoteProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x98f);
    uStack_50 = 0x346d6f;
    fprintf(_stderr,"Expression: gPID != dwTargetProcessId, Description:  called on local thread\n")
    ;
  }
  if (shridSynchData == 0) {
    uStack_50 = 0x346da1;
    fprintf(_stderr,"] %s %s:%d","DelegateSignalingToRemoteProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x990);
    uStack_50 = 0x346db3;
    fprintf(_stderr,
            "Expression: NULLSharedID != shridSynchData, Description: NULL shared identifier\n");
  }
  if (this == (CSynchData *)0x0) {
    uStack_50 = 0x346de5;
    fprintf(_stderr,"] %s %s:%d","DelegateSignalingToRemoteProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x993);
    uStack_50 = 0x346dfa;
    fprintf(_stderr,
            "Expression: NULL != psdSynchData, Description: Bad shared SynchData identifier (%p)\n",
            shridSynchData);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    uStack_50 = 0x346e14;
    local_44 = CSynchData::GetSignalCount(this);
    LOCK();
    this->m_lRefCount = this->m_lRefCount + 1;
    UNLOCK();
    local_3d = 2;
    lVar1 = 9;
    do {
      (&local_3d)[lVar1] = *(undefined1 *)((long)&uStack_50 + lVar1 + 3);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0xd);
    _dwSigCount = shridSynchData;
    if (rgSendBuf + 6 < rgSendBuf + 5) {
      uStack_50 = 0x346e76;
      fprintf(_stderr,"] %s %s:%d","DelegateSignalingToRemoteProcess",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
              ,0x9b7);
      uStack_50 = 0x346e87;
      fprintf(_stderr,"Expression: pbyDst <= rgSendBuf + MsgSize + 1, Description: Buffer overrun");
    }
    uStack_50 = 0x346eb3;
    fprintf(_stderr,"] %s %s:%d","SendMsgToRemoteWorker",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x9d4);
    uStack_50 = 0x346ec4;
    fprintf(_stderr,"There should never be a reason to send a message to a remote worker\n");
    if (PAL_InitializeChakraCoreCalled != false) {
      uStack_50 = 0x346ed6;
      CSynchData::Release(this,pthrCurrent);
      if (*(long *)(in_FS_OFFSET + 0x28) == rgSendBuf._5_8_) {
        return 0x54f;
      }
      uStack_50 = 0x346f01;
      __stack_chk_fail();
    }
  }
  uStack_50 = 0x346efc;
  abort();
}

Assistant:

PAL_ERROR CPalSynchronizationManager::DelegateSignalingToRemoteProcess(
        CPalThread * pthrCurrent,
        DWORD dwTargetProcessId,
        SharedID shridSynchData)
    {
        const int MsgSize = sizeof(BYTE) + sizeof(SharedID) + sizeof(DWORD);
        int i;
        PAL_ERROR palErr = NO_ERROR;
        BYTE rgSendBuf[MsgSize];
        BYTE * pbySrc, * pbyDst = rgSendBuf;
        DWORD dwSigCount;
        CSynchData * psdSynchData =
            SharedIDToTypePointer(CSynchData, shridSynchData);

        _ASSERT_MSG(gPID != dwTargetProcessId,
                    " called on local thread\n");
        _ASSERT_MSG(NULLSharedID != shridSynchData, "NULL shared identifier\n");
        _ASSERT_MSG(NULL != psdSynchData,
                    "Bad shared SynchData identifier (%p)\n",
                    (VOID*)shridSynchData);
        _ASSERT_MSG(MsgSize <= PIPE_BUF,
                    "Message too long [MsgSize=%d PIPE_BUF=%d]\n",
                    MsgSize, (int)PIPE_BUF);

        TRACE("Transfering wait all signaling to remote process pid=%x "
              "by sending cmd=%u and shridSynchData=%p over process pipe\n",
              dwTargetProcessId, SynchWorkerCmdDelegatedObjectSignaling,
              (VOID *)shridSynchData);

        dwSigCount = psdSynchData->GetSignalCount();

        // AddRef SynchData to be marshaled to remote process
        psdSynchData->AddRef();

        //
        // Prepare the message
        //

        // Cmd
        *pbyDst++ = (BYTE)(SynchWorkerCmdDelegatedObjectSignaling & 0xFF);

        // CSynchData (not aligned, copy byte by byte)
        pbySrc = (BYTE *)&shridSynchData;
        for (i=0; i<(int)sizeof(SharedID); i++)
        {
            *pbyDst++ = *pbySrc++;
        }

        // Signal Count (not aligned, copy byte by byte)
        pbySrc = (BYTE *)&dwSigCount;
        for (i=0; i<(int)sizeof(DWORD); i++)
        {
            *pbyDst++ = *pbySrc++;
        }

        _ASSERT_MSG(pbyDst <= rgSendBuf + MsgSize + 1, "Buffer overrun");

        // Send the message
        palErr = SendMsgToRemoteWorker(dwTargetProcessId, rgSendBuf,
                                       MsgSize);
        if (NO_ERROR != palErr)
        {
            TRACE("Failed sending message to remote worker in process %u\n",
                  dwTargetProcessId);
            // Undo refcounting
            psdSynchData->Release(pthrCurrent);
            goto WUT_exit;
        }

    WUT_exit:
        return palErr;
    }